

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O2

bool __thiscall
BamTools::ResolveTool::StatsFileReader::ParseOptionLine
          (StatsFileReader *this,string *line,ResolveSettings *settings)

{
  __type _Var1;
  reference __lhs;
  reference pvVar2;
  ostream *poVar3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  stringstream value;
  
  Utilities::Split(&fields,line,'=');
  if ((long)fields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)fields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x40) {
    bVar4 = false;
    goto LAB_00175fdf;
  }
  __lhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(&fields,0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&fields,1);
  std::__cxx11::stringstream::stringstream((stringstream *)&value,(string *)pvVar2,_S_out|_S_in);
  _Var1 = std::operator==(__lhs,&OPTION_CONFIDENCEINTERVAL_abi_cxx11_);
  if (_Var1) {
    std::istream::_M_extract<double>((double *)&value);
    settings->HasConfidenceInterval = true;
LAB_00175fa5:
    bVar4 = true;
  }
  else {
    _Var1 = std::operator==(__lhs,&OPTION_FORCEMARKREADGROUPS_abi_cxx11_);
    if (!_Var1) {
      _Var1 = std::operator==(__lhs,&OPTION_MINIMUMMAPQUALITY_abi_cxx11_);
      if (_Var1) {
        std::istream::_M_extract<unsigned_short>((ushort *)&value);
        settings->HasMinimumMapQuality = true;
      }
      else {
        _Var1 = std::operator==(__lhs,&OPTION_UNUSEDMODELTHRESHOLD_abi_cxx11_);
        if (!_Var1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "bamtools resolve ERROR - unrecognized option: ");
          poVar3 = std::operator<<(poVar3,(string *)__lhs);
          poVar3 = std::operator<<(poVar3," in stats file");
          std::endl<char,std::char_traits<char>>(poVar3);
          bVar4 = false;
          goto LAB_00175fd5;
        }
        std::istream::_M_extract<double>((double *)&value);
        settings->HasUnusedModelThreshold = true;
      }
      goto LAB_00175fa5;
    }
    bVar4 = true;
    std::istream::_M_extract<bool>((bool *)&value);
  }
LAB_00175fd5:
  std::__cxx11::stringstream::~stringstream((stringstream *)&value);
LAB_00175fdf:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fields);
  return bVar4;
}

Assistant:

bool ResolveTool::StatsFileReader::ParseOptionLine(const std::string& line,
                                                   ResolveTool::ResolveSettings* settings)
{
    // split line into option, value
    std::vector<std::string> fields = Utilities::Split(line, EQUAL_CHAR);
    if (fields.size() != NUM_OPTIONS_FIELDS) return false;
    const std::string& option = fields.at(0);
    std::stringstream value(fields.at(1));

    // -----------------------------------
    // handle option based on keyword

    // ConfidenceInterval
    if (option == OPTION_CONFIDENCEINTERVAL) {
        value >> settings->ConfidenceInterval;
        settings->HasConfidenceInterval = true;
        return true;
    }

    // ForceMarkReadGroups
    if (option == OPTION_FORCEMARKREADGROUPS) {
        value >> settings->HasForceMarkReadGroups;
        return true;
    }

    // MinimumMapQuality
    if (option == OPTION_MINIMUMMAPQUALITY) {
        value >> settings->MinimumMapQuality;
        settings->HasMinimumMapQuality = true;
        return true;
    }

    // UnusedModelThreshold
    if (option == OPTION_UNUSEDMODELTHRESHOLD) {
        value >> settings->UnusedModelThreshold;
        settings->HasUnusedModelThreshold = true;
        return true;
    }

    // otherwise unknown option
    std::cerr << "bamtools resolve ERROR - unrecognized option: " << option << " in stats file"
              << std::endl;
    return false;
}